

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

void write_srec(char *file,char *ext,int base)

{
  int iVar1;
  size_t sVar2;
  FILE *__stream;
  long lVar3;
  ulong uVar4;
  int iVar5;
  byte bVar6;
  char *__format;
  ulong uVar7;
  int iVar8;
  long lVar9;
  bool bVar10;
  char fname [128];
  uchar (*local_e8) [8192];
  char local_b8 [136];
  
  if (((*ext == 'm') && (ext[1] == 'x')) && (ext[2] == '\0')) {
    __format = "writing mx file... ";
  }
  else {
    __format = "writing s-record file... ";
  }
  printf(__format);
  fflush(_stdout);
  strcpy(local_b8,file);
  sVar2 = strlen(local_b8);
  (local_b8 + sVar2)[0] = '.';
  (local_b8 + sVar2)[1] = '\0';
  strcat(local_b8,ext);
  __stream = fopen(local_b8,"w");
  if (__stream == (FILE *)0x0) {
    printf("can not open file \'%s\'!\n",local_b8);
  }
  else {
    if (-1 < max_bank) {
      local_e8 = rom;
      uVar4 = 0;
      iVar8 = 0;
      lVar3 = 0;
      do {
        uVar7 = 0;
        do {
          if (map[lVar3][uVar7] == 0xff) {
            bVar10 = iVar8 != 0;
          }
          else {
            if (iVar8 == 0) {
              uVar4 = uVar7 & 0xffffffff;
            }
            iVar8 = iVar8 + 1;
            bVar10 = iVar8 == 0x20;
          }
          if ((bool)((iVar8 != 0 && uVar7 == 0x1fff) | bVar10)) {
            iVar1 = (int)uVar4;
            iVar5 = (int)lVar3 * 0x2000 + base + iVar1;
            bVar6 = (char)((uint)iVar5 >> 0x10) + (char)iVar5 + (char)iVar8 +
                    (char)((uint)iVar5 >> 8) + 4;
            fprintf(__stream,"S2%02X%06X",(ulong)(iVar8 + 4));
            if (iVar8 != 0) {
              lVar9 = 0;
              do {
                bVar6 = bVar6 + (*local_e8)[lVar9 + iVar1];
                fprintf(__stream,"%02X",(ulong)(*local_e8)[lVar9 + iVar1]);
                lVar9 = lVar9 + 1;
              } while (iVar8 != (int)lVar9);
              uVar4 = (ulong)(uint)(iVar1 + (int)lVar9);
            }
            iVar8 = 0;
            fprintf(__stream,"%02X\n",(ulong)(byte)~bVar6);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != 0x2000);
        local_e8 = local_e8 + 1;
        bVar10 = lVar3 < max_bank;
        lVar3 = lVar3 + 1;
      } while (bVar10);
    }
    fprintf(__stream,"S804%06X%02X",(ulong)((map[0][0] & 0xe0) << 8),
            (ulong)(map[0][0] & 0xffffffe0 ^ 0xfb));
    fclose(__stream);
    puts("OK");
  }
  return;
}

Assistant:

void
write_srec(char *file, char *ext, int base)
{
	unsigned char data, chksum;
	char  fname[128];
	int   addr, dump, cnt, pos, i, j;
	FILE *fp;

	/* status message */
	if (!strcmp(ext, "mx"))
		printf("writing mx file... ");
	else
		printf("writing s-record file... ");

	/* flush output */
	fflush(stdout);

	/* add the file extension */
	strcpy(fname, file);
	strcat(fname, ".");
	strcat(fname, ext);

	/* open the file */
	if ((fp = fopen(fname, "w")) == NULL) {
		printf("can not open file '%s'!\n", fname);
		return;
	}

	/* dump the rom */
	dump = 0;
	cnt  = 0;
	pos  = 0;

	for (i = 0; i <= max_bank; i++) {
		for (j = 0; j < 8192; j++) {
			if (map[i][j] != 0xFF) {
				/* data byte */
				if (cnt == 0)
					pos = j;
				cnt++;
				if (cnt == 32)
					dump = 1;
			}
			else {
				/* free byte */
				if (cnt)
					dump = 1;
			}
			if (j == 8191)
				if (cnt)
					dump = 1;

			/* dump */
			if (dump) {
				dump = 0;
				addr = base + (i << 13) + pos;
				chksum = cnt + ((addr >> 16) & 0xFF) +
							   ((addr >> 8) & 0xFF) +
							   ((addr) & 0xFF) +
							   4;

				/* number, address */
				fprintf(fp, "S2%02X%06X", cnt + 4, addr);

				/* code */
				while (cnt) {
					data = rom[i][pos++];
					chksum += data;
					fprintf(fp, "%02X", data);
					cnt--;
				}

				/* chksum */
				fprintf(fp, "%02X\n", (~chksum) & 0xFF);
			}
		}
	}

	/* starting address */
	addr   = ((map[0][0] >> 5) << 13);
	chksum = ((addr >> 8) & 0xFF) + (addr & 0xFF) + 4;
	fprintf(fp, "S804%06X%02X", addr, (~chksum) & 0xFF);

	/* ok */
	fclose(fp);
	printf("OK\n");
}